

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule_impl.h
# Opt level: O2

void __thiscall icu_63::RuleChain::RuleChain(RuleChain *this)

{
  this->_vptr_RuleChain = (_func_int **)&PTR__RuleChain_003ce818;
  (this->fKeyword).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->fKeyword).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fNext = (RuleChain *)0x0;
  this->ruleHeader = (OrConstraint *)0x0;
  (this->fDecimalSamples).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->fDecimalSamples).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fIntegerSamples).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->fIntegerSamples).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fDecimalSamplesUnbounded = '\0';
  this->fIntegerSamplesUnbounded = '\0';
  this->fInternalStatus = U_ZERO_ERROR;
  return;
}

Assistant:

RuleChain() = default;